

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future_std.h
# Opt level: O3

unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
__thiscall
prometheus::detail::
make_unique<prometheus::detail::Endpoint,CivetServer&,std::__cxx11::string_const&>
          (detail *this,CivetServer *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  pointer pcVar1;
  Endpoint *this_00;
  string local_48;
  
  this_00 = (Endpoint *)operator_new(0x48);
  pcVar1 = (args_1->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + args_1->_M_string_length);
  Endpoint::Endpoint(this_00,args,&local_48);
  *(Endpoint **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>,_true,_true>
          )(__uniq_ptr_data<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}